

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_impl.cpp
# Opt level: O3

void dump_frame(FILE *fp,MppFrame frame,RK_U8 *tmp,RK_U32 w,RK_U32 h)

{
  int iVar1;
  size_t size;
  long lVar2;
  MppFrameFormat MVar3;
  RK_U32 RVar4;
  RK_U32 RVar5;
  RK_U32 RVar6;
  int iVar7;
  MppBuffer buffer;
  ulong uVar8;
  RK_S64 RVar9;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  RK_U8 *pRVar14;
  RK_U8 *pRVar15;
  RK_U8 RVar16;
  RK_U32 RVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  RK_U8 *pRVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  uint local_84;
  RK_U8 *local_80;
  
  MVar3 = mpp_frame_get_fmt(frame);
  MVar3 = MVar3 & 0xfffff;
  RVar4 = mpp_frame_get_width(frame);
  local_84 = mpp_frame_get_height(frame);
  RVar5 = mpp_frame_get_hor_stride(frame);
  uVar22 = (ulong)RVar5;
  RVar6 = mpp_frame_get_ver_stride(frame);
  buffer = mpp_frame_get_buffer(frame);
  local_80 = (RK_U8 *)mpp_buffer_get_ptr_with_caller(buffer,"dump_frame");
  if (tmp == (RK_U8 *)0x0) {
    uVar20 = 0;
    switch(MVar3) {
    case MPP_FMT_YUV420SP:
    case MPP_FMT_YUV420P:
      uVar20 = RVar6 * RVar5 * 3 >> 1;
      break;
    case MPP_FMT_YUV420SP_10BIT:
      size = (ulong)RVar4 * 2;
      pRVar14 = (RK_U8 *)mpp_osal_malloc("dump_frame",size);
      if (pRVar14 == (RK_U8 *)0x0) {
        _mpp_log_l(4,"mpp_impl","tmp_line malloc fail",(char *)0x0);
        return;
      }
      if (local_84 != 0) {
        pRVar15 = local_80 + RVar6 * RVar5;
        uVar20 = RVar4 + 7;
        RVar5 = 0;
        pRVar21 = local_80;
        do {
          if (7 < uVar20) {
            RVar17 = 0;
            do {
              rearrange_pix(pRVar14,pRVar21,RVar17);
              RVar17 = RVar17 + 1;
            } while (uVar20 >> 3 != RVar17);
          }
          fwrite(pRVar14,size,1,(FILE *)fp);
          RVar5 = RVar5 + 1;
          pRVar21 = pRVar21 + uVar22;
        } while (RVar5 != local_84);
        if (local_84 != 1) {
          uVar13 = 0;
          do {
            if (7 < uVar20) {
              RVar5 = 0;
              do {
                rearrange_pix(pRVar14,pRVar15,RVar5);
                RVar5 = RVar5 + 1;
              } while (uVar20 >> 3 != RVar5);
            }
            fwrite(pRVar14,size,1,(FILE *)fp);
            uVar13 = uVar13 + 1;
            pRVar15 = pRVar15 + uVar22;
          } while (uVar13 != local_84 >> 1);
        }
      }
      mpp_osal_free("dump_frame",pRVar14);
      uVar23 = (ulong)local_84;
      uVar20 = 0;
      goto LAB_0013a9fe;
    case MPP_FMT_YUV422SP:
      uVar20 = RVar6 * RVar5 * 2;
      break;
    case MPP_FMT_YUV422SP_10BIT:
      break;
    default:
      if (MVar3 == MPP_FMT_YUV444SP) {
        uVar20 = RVar6 * RVar5 * 3;
      }
    }
    uVar23 = (ulong)local_84;
    goto LAB_0013a9fe;
  }
  if (h < RVar6 || w < RVar5) {
    uVar23 = (ulong)((w + RVar5) - 1) / (ulong)w;
    uVar24 = (ulong)((h + RVar6) - 1) / (ulong)h;
    if ((uint)uVar24 < (uint)uVar23) {
      uVar24 = uVar23;
    }
    uVar8 = (ulong)RVar4;
    uVar23 = (ulong)local_84;
    uVar13 = (uint)(uVar8 / uVar24);
    RVar4 = uVar13 & 0xfffffffe;
    uVar20 = (uint)(uVar23 / uVar24);
    local_84 = uVar20 & 0xfffffffe;
    if ((uVar23 / uVar24 & 0xfffffffe) == 0) {
LAB_0013a7d8:
      uVar23 = 0;
    }
    else {
      uVar18 = (ulong)RVar4;
      iVar7 = (int)uVar24;
      uVar19 = 0;
      pRVar14 = local_80;
      pRVar21 = tmp;
      do {
        if ((uVar8 / uVar24 & 0xfffffffe) != 0) {
          uVar23 = 0;
          do {
            uVar11 = iVar7 * (int)uVar23;
            if (MVar3 == MPP_FMT_YUV420SP) {
              RVar16 = pRVar14[uVar11];
            }
            else if (MVar3 == MPP_FMT_YUV420SP_10BIT) {
              uVar12 = (ulong)(uVar11 * 10 >> 3);
              bVar10 = (char)uVar11 * '\x02' & 6;
              RVar16 = (RK_U8)(((uint)pRVar14[uVar12 + 1] << (8 - bVar10 & 0x1f) |
                               (uint)(pRVar14[uVar12] >> bVar10)) >> 2);
            }
            else {
              RVar16 = '\0';
            }
            pRVar21[uVar23] = RVar16;
            uVar23 = uVar23 + 1;
          } while (uVar23 < uVar18);
        }
        pRVar21 = pRVar21 + uVar18;
        pRVar14 = pRVar14 + iVar7 * RVar5;
        uVar19 = uVar19 + 1;
        uVar23 = (ulong)local_84;
      } while (uVar19 < local_84);
      if (1 < uVar20) {
        pRVar14 = tmp + local_84 * RVar4;
        local_80 = local_80 + RVar6 * RVar5;
        uVar19 = 0;
        do {
          if (1 < uVar13) {
            uVar23 = 0;
            do {
              lVar2 = uVar23 * 2;
              uVar11 = iVar7 * (int)lVar2;
              if (MVar3 == MPP_FMT_YUV420SP) {
                pRVar14[lVar2] = local_80[uVar11];
                RVar16 = local_80[(ulong)uVar11 + 1];
              }
              else if (MVar3 == MPP_FMT_YUV420SP_10BIT) {
                uVar24 = (ulong)(uVar11 * 10 >> 3);
                bVar10 = (char)uVar11 * '\x02' & 4;
                pRVar14[lVar2] =
                     (RK_U8)(((uint)local_80[uVar24 + 1] << (8 - bVar10 & 0x1f) |
                             (uint)(local_80[uVar24] >> bVar10)) >> 2);
                iVar1 = uVar11 * 2 + 2;
                uVar24 = (ulong)((uint)(iVar1 * 5) >> 3);
                bVar10 = (byte)iVar1 & 6;
                RVar16 = (RK_U8)(((uint)local_80[uVar24 + 1] << (8 - bVar10 & 0x1f) |
                                 (uint)(local_80[uVar24] >> bVar10)) >> 2);
              }
              else {
                pRVar14[lVar2] = '\0';
                RVar16 = '\0';
              }
              pRVar14[lVar2 + 1] = RVar16;
              uVar23 = uVar23 + 1;
            } while (uVar23 < uVar13 >> 1);
          }
          pRVar14 = pRVar14 + uVar18;
          local_80 = local_80 + iVar7 * RVar5;
          uVar19 = uVar19 + 1;
        } while (uVar19 < uVar20 >> 1);
        goto LAB_0013a9d7;
      }
    }
  }
  else {
    if (MVar3 == MPP_FMT_YUV420SP_10BIT) {
      if (local_84 == 0) goto LAB_0013a7d8;
      uVar23 = (ulong)RVar4;
      RVar17 = 0;
      pRVar14 = tmp;
      pRVar21 = local_80;
      do {
        if (RVar4 != 0) {
          bVar10 = 0;
          uVar24 = 0;
          pRVar15 = pRVar14;
          do {
            uVar8 = uVar24 >> 3 & 0x1fffffff;
            *pRVar15 = (RK_U8)(((uint)pRVar21[uVar8 + 1] << (8 - (bVar10 & 6) & 0x1f) |
                               (uint)(pRVar21[uVar8] >> (bVar10 & 6))) >> 2);
            uVar24 = uVar24 + 10;
            pRVar15 = pRVar15 + 1;
            bVar10 = bVar10 + 2;
          } while (uVar23 * 10 != uVar24);
        }
        pRVar14 = pRVar14 + uVar23;
        pRVar21 = pRVar21 + RVar5;
        RVar17 = RVar17 + 1;
      } while (RVar17 != local_84);
      if (local_84 == 1) {
        uVar23 = 1;
        goto LAB_0013a9dc;
      }
      pRVar14 = tmp + local_84 * RVar4;
      local_80 = local_80 + RVar6 * RVar5;
      uVar20 = 0;
      do {
        if (RVar4 != 0) {
          bVar10 = 0;
          uVar24 = 0;
          pRVar21 = pRVar14;
          do {
            uVar8 = uVar24 >> 3 & 0x1fffffff;
            *pRVar21 = (RK_U8)(((uint)local_80[uVar8 + 1] << (8 - (bVar10 & 6) & 0x1f) |
                               (uint)(local_80[uVar8] >> (bVar10 & 6))) >> 2);
            uVar24 = uVar24 + 10;
            pRVar21 = pRVar21 + 1;
            bVar10 = bVar10 + 2;
          } while (uVar23 * 10 != uVar24);
        }
        pRVar14 = pRVar14 + uVar23;
        local_80 = local_80 + RVar5;
        uVar20 = uVar20 + 1;
      } while (uVar20 != local_84 >> 1);
    }
LAB_0013a9d7:
    uVar23 = (ulong)local_84;
  }
LAB_0013a9dc:
  uVar20 = (uint)(long)((double)(RVar4 * (int)uVar23) * 1.5);
  local_80 = tmp;
LAB_0013a9fe:
  RVar9 = mpp_frame_get_pts(frame);
  _mpp_log_l(4,"mpp_impl","dump_yuv: w:h [%d:%d] stride [%d:%d] pts %lld\n",(char *)0x0,(ulong)RVar4
             ,uVar23,uVar22,(ulong)RVar6,RVar9);
  if (uVar20 != 0) {
    fwrite(local_80,1,(ulong)uVar20,(FILE *)fp);
  }
  fflush((FILE *)fp);
  return;
}

Assistant:

static void dump_frame(FILE *fp, MppFrame frame, RK_U8 *tmp, RK_U32 w, RK_U32 h)
{
    RK_U32 i = 0, j = 0;
    RK_U32 fmt = (mpp_frame_get_fmt(frame) & MPP_FRAME_FMT_MASK);
    RK_U32 width = mpp_frame_get_width(frame);
    RK_U32 height = mpp_frame_get_height(frame);
    RK_U32 hor_stride = mpp_frame_get_hor_stride(frame);
    RK_U32 ver_stride = mpp_frame_get_ver_stride(frame);
    RK_U8 *p_buf = (RK_U8 *) mpp_buffer_get_ptr(mpp_frame_get_buffer(frame));

    RK_U8 *psrc = p_buf;
    RK_U8 *pdes = tmp;
    RK_U32 size = 0;

    if (pdes) {
        if (hor_stride > w || ver_stride > h) {
            RK_U32 step = MPP_MAX((hor_stride + w - 1) / w,
                                  (ver_stride + h - 1) / h);
            RK_U32 img_w = width / step;
            RK_U32 img_h = height / step;

            img_w -= img_w & 0x1;
            img_h -= img_h & 0x1;
            for (i = 0; i < img_h; i++) {
                for (j = 0; j < img_w; j++)
                    pdes[j] = fetch_data(fmt, psrc, j * step);
                pdes += img_w;
                psrc += step * hor_stride;
            }
            psrc = p_buf + hor_stride * ver_stride;
            pdes = tmp + img_w * img_h;
            for (i = 0; i < (img_h / 2); i++) {
                for (j = 0; j < (img_w / 2); j++) {
                    pdes[2 * j + 0] = fetch_data(fmt, psrc, 2 * j * step + 0);
                    pdes[2 * j + 1] = fetch_data(fmt, psrc, 2 * j * step + 1);
                }
                pdes += img_w;
                psrc += step * hor_stride;
            }
            width = img_w;
            height = img_h;
        } else if (fmt == MPP_FMT_YUV420SP_10BIT) {
            for (i = 0; i < height; i++) {
                for (j = 0; j < width; j++)
                    pdes[j] = fetch_data(fmt, psrc, j);
                pdes += width;
                psrc += hor_stride;
            }
            psrc = p_buf + hor_stride * ver_stride;
            pdes = tmp + width * height;
            for (i = 0; i < height / 2; i++) {
                for (j = 0; j < width; j++)
                    pdes[j] = fetch_data(fmt, psrc, j);
                pdes += width;
                psrc += hor_stride;
            }
        }
        size = width * height * 1.5;
    } else {
        tmp = p_buf;
        switch (fmt) {
        case MPP_FMT_YUV420SP :
        case MPP_FMT_YUV420P : {
            size = hor_stride * ver_stride * 3 / 2;
        } break;
        case MPP_FMT_YUV422SP : {
            size = hor_stride * ver_stride * 2;
        } break;
        case MPP_FMT_YUV444SP : {
            size = hor_stride * ver_stride * 3;
        } break;
        case MPP_FMT_YUV420SP_10BIT : {
            RK_U8 *base_y = p_buf;
            RK_U8 *base_c = p_buf + hor_stride * ver_stride;
            RK_U8 *tmp_line = (RK_U8 *)mpp_malloc(RK_U16, width);

            if (!tmp_line) {
                mpp_log("tmp_line malloc fail");
                return;
            }

            for (i = 0; i < height; i++, base_y += hor_stride) {
                for (j = 0; j < MPP_ALIGN(width, 8) / 8; j++)
                    rearrange_pix(tmp_line, base_y, j);
                fwrite(tmp_line, width * sizeof(RK_U16), 1, fp);
            }

            for (i = 0; i < height / 2; i++, base_c += hor_stride) {
                for (j = 0; j < MPP_ALIGN(width, 8) / 8; j++)
                    rearrange_pix(tmp_line, base_c, j);
                fwrite(tmp_line, width * sizeof(RK_U16), 1, fp);
            }
            MPP_FREE(tmp_line);
        }
        default : break;
        }
    }
    mpp_log("dump_yuv: w:h [%d:%d] stride [%d:%d] pts %lld\n",
            width, height, hor_stride, ver_stride, mpp_frame_get_pts(frame));
    if (size)
        fwrite(tmp, 1, size, fp);
    fflush(fp);
}